

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O0

void ht_task_scheduler_destroy(HT_TaskScheduler *task_scheduler)

{
  ulong local_18;
  size_t i;
  HT_TaskScheduler *task_scheduler_local;
  
  for (local_18 = 0; local_18 < (task_scheduler->tasks).size; local_18 = local_18 + 1) {
    ht_free((task_scheduler->tasks).data[local_18]);
  }
  ht_bag_void_ptr_deinit(&task_scheduler->tasks);
  ht_free(task_scheduler);
  return;
}

Assistant:

void
ht_task_scheduler_destroy(HT_TaskScheduler* task_scheduler)
{
    size_t i = 0;
    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        ht_free(task_scheduler->tasks.data[i]);
    }

    ht_bag_void_ptr_deinit(&task_scheduler->tasks);
    ht_free(task_scheduler);
}